

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O1

void __thiscall
reader_authority_suite::test_ipv6_line_7a_v6::test_method(test_ipv6_line_7a_v6 *this)

{
  int iVar1;
  char *local_150;
  view_type *local_148;
  undefined1 local_140 [8];
  undefined8 local_138;
  shared_count sStack_130;
  char local_128 [4];
  view_type local_124;
  undefined8 *local_110;
  char *local_108;
  undefined **local_100;
  undefined1 local_f8;
  undefined8 *local_f0;
  char **local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  view_type **local_c8;
  char *local_c0;
  char *local_b8;
  basic_authority<char> local_b0;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  char input [18];
  
  builtin_strncpy(input,"[1111::1234:5678]",0x12);
  local_b0.super_base<char,_trial::url::reader::basic_authority>.input.len_ = strlen(input);
  local_b0.super_base<char,_trial::url::reader::basic_authority>.current_token = end;
  local_b0.super_base<char,_trial::url::reader::basic_authority>.input.ptr_ = input;
  local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_ = input;
  local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.len_ =
       local_b0.super_base<char,_trial::url::reader::basic_authority>.input.len_;
  trial::url::reader::basic_authority<char>::do_next(&local_b0);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x159);
  local_124.len_._4_1_ = 0;
  local_124._4_8_ = &PTR__lazy_ostream_00186260;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_148 = &local_124;
  local_124.ptr_._0_4_ =
       local_b0.super_base<char,_trial::url::reader::basic_authority>.current_token;
  local_150 = local_128;
  local_128[0] = '\x06';
  local_128[1] = '\0';
  local_128[2] = '\0';
  local_128[3] = '\0';
  local_140[0] = local_b0.super_base<char,_trial::url::reader::basic_authority>.current_token ==
                 authority_host_ipv6;
  local_138 = 0;
  sStack_130.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b8 = "";
  local_c8 = &local_148;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00186618;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_150;
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_00186618;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_130);
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_78,0x15a);
  local_124.len_._4_1_ = 0;
  local_124._4_8_ = &PTR__lazy_ostream_00186260;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  if (local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.len_ == 0xf) {
    iVar1 = bcmp(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_,
                 "1111::1234:5678",0xf);
    local_140[0] = iVar1 == 0;
  }
  else {
    local_140[0] = false;
  }
  local_138 = 0;
  sStack_130.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b8 = "";
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00186598;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_148;
  local_150 = "1111::1234:5678";
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_00186b58;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_150;
  local_148 = &local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view;
  boost::test_tools::tt_detail::report_assertion
            (local_140,(undefined1 *)((long)&local_124.ptr_ + 4),&local_c0,0x15a,2,2,2,
             "reader.literal()",&local_e0,"\"1111::1234:5678\"",&local_100);
  boost::detail::shared_count::~shared_count(&sStack_130);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ipv6_line_7a_v6)
{
    const char input[] = "[1111::1234:5678]";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_ipv6);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1111::1234:5678");
}